

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t cmp_key_mbs(archive_rb_node *n,void *key)

{
  wchar_t wVar1;
  char *in_RAX;
  char *p;
  char *local_18;
  
  local_18 = in_RAX;
  archive_mstring_get_mbs((archive_conflict *)0x0,(archive_mstring *)(n[1].rb_nodes + 1),&local_18);
  if (local_18 == (char *)0x0) {
    wVar1 = L'\xffffffff';
  }
  else {
    wVar1 = strcmp(local_18,(char *)key);
  }
  return wVar1;
}

Assistant:

static int
cmp_key_mbs(const struct archive_rb_node *n, const void *key)
{
	struct match_file *f = (struct match_file *)(uintptr_t)n;
	const char *p;

	archive_mstring_get_mbs(NULL, &(f->pathname), &p);
	if (p == NULL)
		return (-1);
	return (strcmp(p, (const char *)key));
}